

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O0

bool Omega_h::
     transform_reduce<Omega_h::IntIterator,Omega_h::are_close_abs(Omega_h::Read<double>,Omega_h::Read<double>,double)::__0,bool,Omega_h::logical_and<bool>>
               (int first,int last,byte init,type *param_4)

{
  bool bVar1;
  bool local_96;
  __0 local_80 [8];
  type transform_local;
  type *transform_local_1;
  int local_48;
  bool init_local;
  int iStack_44;
  IntIterator last_local;
  IntIterator first_local;
  
  transform_local_1._6_1_ = (bool)(init & 1);
  entering_parallel = 1;
  transform_local.tol = (Real)param_4;
  local_48 = last;
  iStack_44 = first;
  are_close_abs(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::__0(local_80,param_4);
  entering_parallel = 0;
  while( true ) {
    _last_local = &local_48;
    if (iStack_44 == local_48) break;
    bVar1 = std::
            remove_reference<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp:95:20)_&>
            ::type::operator()(local_80,iStack_44);
    local_96 = false;
    if (transform_local_1._6_1_ != false) {
      local_96 = bVar1;
    }
    transform_local_1._6_1_ = local_96;
    iStack_44 = iStack_44 + 1;
  }
  are_close_abs(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0(local_80);
  return transform_local_1._6_1_;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}